

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::ComputeTargetOrder(cmGlobalGenerator *this)

{
  pointer puVar1;
  cmLocalGenerator *pcVar2;
  pointer puVar3;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt;
  pointer puVar4;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lgen;
  pointer puVar5;
  size_t index;
  size_t local_38;
  
  local_38 = 0;
  puVar1 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->LocalGenerators).
                super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    pcVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    puVar3 = *(pointer *)
              ((long)&(pcVar2->GeneratorTargets).
                      super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
              + 8);
    for (puVar4 = *(pointer *)
                   &(pcVar2->GeneratorTargets).
                    super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                    ._M_impl; puVar4 != puVar3; puVar4 = puVar4 + 1) {
      ComputeTargetOrder(this,(cmGeneratorTarget *)
                              (puVar4->_M_t).
                              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ,&local_38);
    }
  }
  if (local_38 == (this->TargetOrderIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    return;
  }
  __assert_fail("index == this->TargetOrderIndex.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalGenerator.cxx"
                ,0x710,"void cmGlobalGenerator::ComputeTargetOrder()");
}

Assistant:

void cmGlobalGenerator::ComputeTargetOrder()
{
  size_t index = 0;
  auto const& lgens = this->GetLocalGenerators();
  for (auto const& lgen : lgens) {
    const auto& targets = lgen->GetGeneratorTargets();
    for (const auto& gt : targets) {
      this->ComputeTargetOrder(gt.get(), index);
    }
  }
  assert(index == this->TargetOrderIndex.size());
}